

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseBlockExpr(Parser *this)

{
  line_t *plVar1;
  TokenType TVar2;
  pointer pcVar3;
  pointer pcVar4;
  undefined1 auVar5 [8];
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  long *plVar9;
  long *plVar10;
  CompileContext *pCVar11;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  pointer __old_p;
  undefined1 auVar12 [8];
  bool bVar13;
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> current;
  Token start;
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  _Alloc_hider _Stack_a0;
  undefined1 local_98 [24];
  line_t local_80;
  col_t local_7c;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  local_78;
  TokenType local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48 [2];
  line_t local_38;
  col_t local_34;
  
  local_60 = (in_RSI->m_previous).type;
  local_58._M_allocated_capacity = (size_type)local_48;
  pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
  local_34 = (in_RSI->m_previous).col;
  local_38 = (in_RSI->m_previous).line;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar9 = (long *)operator_new(0x38);
  local_a8._0_4_ = (in_RSI->m_previous).type;
  pcVar3 = local_98 + 8;
  pcVar4 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  _Stack_a0._M_p = pcVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_a0,pcVar4,pcVar4 + (in_RSI->m_previous).lexeme._M_string_length);
  plVar1 = &(in_RSI->m_previous).line;
  local_7c = (in_RSI->m_previous).col;
  local_80 = *plVar1;
  *plVar9 = (long)&PTR__UnitExpr_00128f88;
  *(undefined4 *)(plVar9 + 1) = local_a8._0_4_;
  plVar9[2] = (long)(plVar9 + 4);
  if (_Stack_a0._M_p == pcVar3) {
    plVar9[4] = CONCAT71(local_98._9_7_,local_98[8]);
    plVar9[5] = local_98._16_8_;
  }
  else {
    plVar9[2] = (long)_Stack_a0._M_p;
    plVar9[4] = CONCAT71(local_98._9_7_,local_98[8]);
  }
  plVar9[3] = local_98._0_8_;
  local_98._0_8_ = 0;
  local_98[8] = '\0';
  *(col_t *)((long)plVar9 + 0x34) = (in_RSI->m_previous).col;
  *(line_t *)(plVar9 + 6) = *plVar1;
  if (local_60 == EQUAL_GREATER) {
    _Stack_a0._M_p = pcVar3;
    parseExpr((Parser *)local_a8);
    auVar12 = local_a8;
    local_a8 = (undefined1  [8])0x0;
    (**(code **)(*plVar9 + 8))(plVar9);
  }
  else {
    auVar12 = (undefined1  [8])plVar9;
    _Stack_a0._M_p = pcVar3;
    if (local_60 == LEFT_BRACE) {
      do {
        TVar2 = (in_RSI->m_current).type;
        auVar12 = (undefined1  [8])plVar9;
        if ((TVar2 == RIGHT_BRACE) || (TVar2 == END_OF_FILE)) break;
        parseStmt((Parser *)local_b0);
        auVar5 = local_b0;
        if ((in_RSI->m_current).type == SEMICOLON) {
          advance(in_RSI);
          std::
          vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
          ::emplace_back<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>
                    ((vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
                      *)&local_78,
                     (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)local_b0);
          bVar13 = (in_RSI->m_current).type != RIGHT_BRACE;
        }
        else {
          local_b0 = (undefined1  [8])0x0;
          if (auVar5 == (undefined1  [8])0x0) {
            plVar10 = (long *)0x0;
          }
          else {
            plVar10 = (long *)__dynamic_cast(auVar5,&Stmt::typeinfo,&ExpressionStmt::typeinfo,0);
          }
          if (plVar10 == (long *)0x0) {
            __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
            local_a8 = (undefined1  [8])local_98;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,"Expected expression or \';\' at end of block.","");
            error(__return_storage_ptr__,in_RSI,(string *)local_a8);
            __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          auVar12 = (undefined1  [8])plVar10[1];
          plVar10[1] = 0;
          if (plVar9 != (long *)0x0) {
            (**(code **)(*plVar9 + 8))(plVar9);
          }
          (**(code **)(*plVar10 + 8))(plVar10);
          bVar13 = false;
        }
        if (local_b0 != (undefined1  [8])0x0) {
          (**(code **)((((string *)local_b0)->_M_dataplus)._M_p + 8))();
        }
        plVar9 = (long *)auVar12;
      } while (bVar13);
      local_a8 = (undefined1  [8])local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"Expected \'}\' at end of block.","");
      expect(in_RSI,RIGHT_BRACE,(string *)local_a8);
      if (local_a8 != (undefined1  [8])local_98) {
        operator_delete((void *)local_a8,local_98._0_8_ + 1);
      }
    }
  }
  pCVar11 = (CompileContext *)operator_new(0x28);
  puVar8 = local_78.
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar7 = local_78.
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = local_78.
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar11->m_source)._M_dataplus._M_p = (pointer)&PTR__BlockExpr_00128fe0;
  (pCVar11->m_source)._M_string_length = (size_type)puVar6;
  (pCVar11->m_source).field_2._M_allocated_capacity = (size_type)puVar7;
  *(pointer *)((long)&(pCVar11->m_source).field_2 + 8) = puVar8;
  local_98._0_8_ = 0;
  local_a8 = (undefined1  [8])0x0;
  _Stack_a0._M_p = (pointer)0x0;
  (pCVar11->m_options).m_filename._M_dataplus._M_p = (pointer)auVar12;
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)local_a8);
  this->m_context = pCVar11;
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector(&local_78);
  if ((undefined8 *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,local_48[0] + 1);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseBlockExpr() {
        Token start = m_previous;

        std::vector<std::unique_ptr<Stmt>> body{};
        std::unique_ptr<Expr> end{std::make_unique<UnitExpr>(m_previous)};

        if (start.type == TokenType::EQUAL_GREATER) {
            end = parseExpr();
        } else if (start.type == TokenType::LEFT_BRACE) {
            while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
                std::unique_ptr<Stmt> current = parseStmt();

                if (consume(TokenType::SEMICOLON)) {
                    body.push_back(std::move(current));
                    if (check(TokenType::RIGHT_BRACE)) break;
                } else {
                    if (auto exprStmt = dynamic_unique_ptr_cast<ExpressionStmt>(std::move(current))) {
                        end = std::move(exprStmt->expr);
                    } else {
                        throw error("Expected expression or ';' at end of block.");
                    }
                    break;
                }
            }

            expect(TokenType::RIGHT_BRACE, "Expected '}' at end of block.");
        }

        return std::make_unique<BlockExpr>(std::move(body), std::move(end));
    }